

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

void __thiscall Lodtalk::ClassTable::~ClassTable(ClassTable *this)

{
  pointer ppOVar1;
  Oop **page;
  pointer ppOVar2;
  
  ppOVar1 = (this->pageTable).super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppOVar2 = (this->pageTable).
                 super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppOVar2 != ppOVar1; ppOVar2 = ppOVar2 + 1) {
    if (*ppOVar2 != (Oop *)0x0) {
      operator_delete__(*ppOVar2);
    }
  }
  std::_Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>::~_Vector_base
            (&(this->pageTable).super__Vector_base<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>)
  ;
  SharedMutex::~SharedMutex(&this->sharedMutex);
  return;
}

Assistant:

ClassTable::~ClassTable()
{
    for(auto &page : pageTable)
        delete [] page;
}